

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  UpsampleLayerParams_InterpolationMode UVar4;
  UpsampleLayerParams_LinearUpsampleMode UVar5;
  string *psVar6;
  bool local_3a5;
  bool local_399;
  undefined1 local_318 [72];
  undefined1 local_2d0 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  string err_1;
  undefined1 local_220 [32];
  undefined1 local_200 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  UpsampleLayerParams *pUStack_138;
  bool validScalingFactors;
  UpsampleLayerParams *params;
  undefined1 local_128 [32];
  Result local_108;
  undefined1 local_d8 [32];
  Result local_b8;
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_88,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_b8.m_message._M_storage._M_storage[4] = '\x01';
    local_b8.m_message._M_storage._M_storage[5] = '\0';
    local_b8.m_message._M_storage._M_storage[6] = '\0';
    local_b8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_003fea5c;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,"Upsample",
               (allocator *)((long)local_108.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_d8 + 0x20),pNVar1,(string *)local_d8,&this->blobNameToRank)
    ;
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_d8 + 0x20));
    Result::~Result((Result *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_108.m_message._M_storage._M_storage + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_003fea5c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_128,"Upsample",(allocator *)((long)&params + 7));
    validateRankCount((Result_conflict *)(local_128 + 0x20),pNVar1,(string *)local_128,3,-1,
                      &this->blobNameToRank);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_128 + 0x20));
    Result::~Result((Result *)(local_128 + 0x20));
    std::__cxx11::string::~string((string *)local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    if (!bVar2) {
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_003fea5c;
    }
  }
  pUStack_138 = Specification::NeuralNetworkLayer::upsample(local_20);
  iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(pUStack_138);
  if (iVar3 == 0) {
    iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUStack_138);
    local_399 = true;
    if (iVar3 != 0) {
      iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUStack_138);
      local_399 = iVar3 == 2;
    }
    local_160._M_storage._M_storage[7] = local_399;
  }
  else {
    iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUStack_138);
    local_3a5 = false;
    if (iVar3 == 0) {
      iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(pUStack_138);
      local_3a5 = iVar3 == 2;
    }
    local_160._M_storage._M_storage[7] = local_3a5;
  }
  if ((bool)local_160._M_storage._M_storage[7] == false) {
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x20),"Invalid scaling factor in upsampling layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
    std::operator+(&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x20),
                   "\'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
                  );
    iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(pUStack_138);
    std::__cxx11::to_string((string *)local_200,iVar3);
    std::operator+(&local_1a0,&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    std::operator+(&local_180,&local_1a0," and fractionalScalingFactor of size ");
    iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUStack_138);
    std::__cxx11::to_string((string *)local_220,iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160,
                   &local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)(local_200 + 0x20));
    Result::Result((Result *)&err_1.super__Rb_tree_node_base._M_right,INVALID_MODEL_PARAMETERS,
                   &local_160);
    Result::operator=((Result *)__return_storage_ptr__,
                      (Result *)&err_1.super__Rb_tree_node_base._M_right);
    Result::~Result((Result *)&err_1.super__Rb_tree_node_base._M_right);
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_b8.m_message._M_storage._M_storage[4] = '\x01';
    local_b8.m_message._M_storage._M_storage[5] = '\0';
    local_b8.m_message._M_storage._M_storage[6] = '\0';
    local_b8.m_message._M_storage._M_storage[7] = '\0';
    std::__cxx11::string::~string((string *)&local_160);
  }
  else {
    iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUStack_138);
    if ((iVar3 == 2) &&
       ((UVar4 = Specification::UpsampleLayerParams::mode(pUStack_138),
        UVar4 == UpsampleLayerParams_InterpolationMode_NN ||
        (UVar5 = Specification::UpsampleLayerParams::linearupsamplemode(pUStack_138),
        UVar5 == UpsampleLayerParams_LinearUpsampleMode_DEFAULT)))) {
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::operator+(&local_288,"Invalid upsample layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     &local_288,
                     "\'. Fractional upsample only compatible with align_corners=true or align_corners=false"
                    );
      std::__cxx11::string::~string((string *)&local_288);
      Result::Result((Result *)&err_2.super__Rb_tree_node_base._M_right,INVALID_MODEL_PARAMETERS,
                     (string *)local_268);
      Result::operator=((Result *)__return_storage_ptr__,
                        (Result *)&err_2.super__Rb_tree_node_base._M_right);
      Result::~Result((Result *)&err_2.super__Rb_tree_node_base._M_right);
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
      std::__cxx11::string::~string((string *)local_268);
    }
    else {
      UVar5 = Specification::UpsampleLayerParams::linearupsamplemode(pUStack_138);
      if ((UVar5 != UpsampleLayerParams_LinearUpsampleMode_DEFAULT) &&
         (UVar4 = Specification::UpsampleLayerParams::mode(pUStack_138),
         UVar4 == UpsampleLayerParams_InterpolationMode_NN)) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_318 + 0x28),"Layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_318 + 0x28),
                       "\' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT."
                      );
        std::__cxx11::string::~string((string *)(local_318 + 0x28));
        Result::Result((Result *)local_318,INVALID_MODEL_PARAMETERS,(string *)local_2d0);
        Result::operator=((Result *)__return_storage_ptr__,(Result *)local_318);
        Result::~Result((Result *)local_318);
        std::__cxx11::string::~string((string *)local_2d0);
      }
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
    }
  }
LAB_003fea5c:
  if ((local_50.m_message._M_storage._M_storage[7] & 1) == 0) {
    Result::~Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Upsample", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Upsample", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}